

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

PHashTable * p_hash_table_new(void)

{
  PHashTable *mem;
  PHashTableNode **ppPVar1;
  
  mem = (PHashTable *)p_malloc0(0x10);
  if (mem == (PHashTable *)0x0) {
    mem = (PHashTable *)0x0;
    printf("** Error: %s **\n","PHashTable::p_hash_table_new: failed(1) to allocate memory");
  }
  else {
    ppPVar1 = (PHashTableNode **)p_malloc0(0x328);
    mem->table = ppPVar1;
    if (ppPVar1 == (PHashTableNode **)0x0) {
      printf("** Error: %s **\n","PHashTable::p_hash_table_new: failed(2) to allocate memory");
      p_free(mem);
      mem = (PHashTable *)0x0;
    }
    else {
      mem->size = 0x65;
    }
  }
  return mem;
}

Assistant:

P_LIB_API PHashTable *
p_hash_table_new (void)
{
	PHashTable *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashTable))) == NULL)) {
		P_ERROR ("PHashTable::p_hash_table_new: failed(1) to allocate memory");
		return NULL;
	}

	if (P_UNLIKELY ((ret->table = p_malloc0 (P_HASH_TABLE_SIZE * sizeof (PHashTableNode *))) == NULL)) {
		P_ERROR ("PHashTable::p_hash_table_new: failed(2) to allocate memory");
		p_free (ret);
		return NULL;
	}

	ret->size = P_HASH_TABLE_SIZE;

	return ret;
}